

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackable_ptr.h
# Opt level: O2

int __thiscall
tower120::detail::trackable_ptr_base::init(trackable_ptr_base *this,EVP_PKEY_CTX *ctx)

{
  trackable_ptr_base *in_RAX;
  
  this->obj = (trackable_base *)ctx;
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    this->prev = (trackable_ptr_base *)0x0;
    in_RAX = *(trackable_ptr_base **)ctx;
    this->next = in_RAX;
    if (in_RAX != (trackable_ptr_base *)0x0) {
      in_RAX->prev = this;
    }
    *(trackable_ptr_base **)ctx = this;
  }
  return (int)in_RAX;
}

Assistant:

void init(trackable_base* obj) noexcept {
                this->obj = obj;
                if (!obj) return;

                auto& first_ptr = this->obj->first_ptr;

                this->prev = nullptr;
                this->next = first_ptr;

                if (first_ptr) first_ptr->prev = this;
                first_ptr = this;
            }